

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O3

void __thiscall HighsNodeQueue::clear(HighsNodeQueue *this)

{
  set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
  *psVar1;
  pointer plVar2;
  _Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false> __ptr_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [8];
  __uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
  _Var7;
  pointer *__ptr;
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [8];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  pointer local_98;
  undefined1 local_88 [8];
  __uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
  _Stack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int64_t local_48;
  double local_40;
  HighsInt local_38;
  vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_> local_28;
  
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  _local_c8 = (undefined1  [16])0x0;
  local_98 = (pointer)0x0;
  _local_88 = (undefined1  [16])0x0;
  local_78 = 0xffffffff;
  uStack_74 = 0xffffffff;
  uStack_70 = 0xffffffff;
  uStack_6c = 0xffffffff;
  local_68 = 0xffffffff;
  uStack_64 = 0xffffffff;
  uStack_60 = 0xffffffff;
  uStack_5c = 0xffffffff;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  local_48 = 0;
  local_40 = INFINITY;
  local_38 = 0;
  setNumCol((HighsNodeQueue *)local_c8,this->numCol);
  local_28.super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->nodes).
       super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->nodes).
  super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._8_8_;
  local_28.super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->nodes).
       super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_28.super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->nodes).
       super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->nodes).
  super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auStack_c0;
  (this->nodes).
  super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_b8._0_8_;
  auStack_c0 = (undefined1  [8])0x0;
  local_b8 = ZEXT816(0);
  std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::~vector
            (&local_28);
  auVar6 = local_88;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = _Stack_80._M_t.
                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                 .
                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                 ._M_head_impl;
  _local_88 = auVar3 << 0x40;
  psVar1 = (this->colLowerNodesPtr)._M_t.
           super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
           ._M_t.
           super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
           .
           super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
           ._M_head_impl;
  (this->colLowerNodesPtr)._M_t.
  super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
  ._M_t.
  super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
  .
  super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
  ._M_head_impl =
       (set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
        *)auVar6;
  if (psVar1 != (set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                 *)0x0) {
    operator_delete(psVar1);
  }
  _Var7._M_t.
  super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
  .
  super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
  ._M_head_impl =
       _Stack_80._M_t.
       super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
       .
       super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
       ._M_head_impl;
  _Stack_80._M_t.
  super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
  .
  super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
  ._M_head_impl =
       (tuple<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
        )(_Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
          )0x0;
  psVar1 = (this->colUpperNodesPtr)._M_t.
           super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
           ._M_t.
           super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
           .
           super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
           ._M_head_impl;
  (this->colUpperNodesPtr)._M_t.
  super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
  ._M_t.
  super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
  .
  super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
  ._M_head_impl =
       (set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
        *)_Var7._M_t.
          super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
          .
          super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
          ._M_head_impl;
  if (psVar1 != (set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                 *)0x0) {
    operator_delete(psVar1);
  }
  plVar2 = (this->freeslots).c.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->freeslots).c.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
  (this->freeslots).c.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a8._8_8_;
  (this->freeslots).c.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_98;
  local_a8 = ZEXT816(0);
  local_98 = (pointer)0x0;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2);
  }
  auVar6 = local_c8;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = auStack_c0;
  _local_c8 = auVar4 << 0x40;
  __ptr_00._M_head_impl =
       (this->allocatorState)._M_t.
       super___uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
       .super__Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false>._M_head_impl;
  (this->allocatorState)._M_t.
  super___uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
  .super__Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false>._M_head_impl =
       (AllocatorState *)auVar6;
  if (__ptr_00._M_head_impl != (AllocatorState *)0x0) {
    std::default_delete<HighsNodeQueue::AllocatorState>::operator()
              ((default_delete<HighsNodeQueue::AllocatorState> *)this,__ptr_00._M_head_impl);
  }
  this->lowerRoot = CONCAT44(uStack_74,local_78);
  this->lowerMin = CONCAT44(uStack_6c,uStack_70);
  this->hybridEstimRoot = CONCAT44(uStack_64,local_68);
  this->hybridEstimMin = CONCAT44(uStack_5c,uStack_60);
  this->suboptimalRoot = CONCAT44(uStack_54,local_58);
  this->suboptimalMin = CONCAT44(uStack_4c,uStack_50);
  this->numSuboptimal = local_48;
  this->optimality_limit = local_40;
  this->numCol = local_38;
  if ((__uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
       )_Stack_80._M_t.
        super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
        .
        super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
       )0x0) {
    operator_delete((void *)_Stack_80._M_t.
                            super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                            .
                            super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                            ._M_head_impl);
  }
  _Stack_80._M_t.
  super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
  .
  super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
  ._M_head_impl =
       (tuple<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
        )(_Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
          )0x0;
  auVar3 = _local_88;
  _Stack_80._M_t.
  super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
  .
  super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
  ._M_head_impl =
       (tuple<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
        )(_Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
          )0x0;
  if ((tuple<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
       )local_88 !=
      (_Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
       )0x0) {
    _local_88 = auVar3;
    operator_delete((void *)local_88);
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = _Stack_80._M_t.
                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                 .
                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                 ._M_head_impl;
  _local_88 = auVar5 << 0x40;
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_);
  }
  std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::~vector
            ((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_> *)
             (local_c8 + 8));
  if ((__uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
       )local_c8 !=
      (__uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
       )0x0) {
    std::default_delete<HighsNodeQueue::AllocatorState>::operator()
              ((default_delete<HighsNodeQueue::AllocatorState> *)local_c8,(AllocatorState *)local_c8
              );
  }
  return;
}

Assistant:

void HighsNodeQueue::clear() {
  const bool original = false;
  HighsNodeQueue nodequeue;
  nodequeue.setNumCol(numCol);
  if (original) {
    *this = std::move(nodequeue);
  } else {
    (*this).nodes = std::move(nodequeue.nodes);
    (*this).colLowerNodesPtr = std::move(nodequeue.colLowerNodesPtr);
    (*this).colUpperNodesPtr = std::move(nodequeue.colUpperNodesPtr);
    (*this).freeslots = std::move(nodequeue.freeslots);
    (*this).allocatorState = std::move(nodequeue.allocatorState);
    (*this).lowerRoot = nodequeue.lowerRoot;
    (*this).lowerMin = nodequeue.lowerMin;
    (*this).hybridEstimRoot = nodequeue.hybridEstimRoot;
    (*this).hybridEstimMin = nodequeue.hybridEstimMin;
    (*this).suboptimalRoot = nodequeue.suboptimalRoot;
    (*this).suboptimalMin = nodequeue.suboptimalMin;
    (*this).numSuboptimal = nodequeue.numSuboptimal;
    (*this).optimality_limit = nodequeue.optimality_limit;
    (*this).numCol = nodequeue.numCol;
  }
}